

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellDir(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *arg_local;
  xmlShellCtxtPtr ctxt_local;
  
  if (ctxt != (xmlShellCtxtPtr)0x0) {
    if (node == (xmlNodePtr)0x0) {
      fprintf((FILE *)ctxt->output,"NULL\n");
    }
    else if ((node->type == XML_DOCUMENT_NODE) || (node->type == XML_HTML_DOCUMENT_NODE)) {
      xmlDebugDumpDocumentHead(ctxt->output,(xmlDocPtr)node);
    }
    else if (node->type == XML_ATTRIBUTE_NODE) {
      xmlDebugDumpAttr(ctxt->output,(xmlAttrPtr)node,0);
    }
    else {
      xmlDebugDumpOneNode(ctxt->output,node,0);
    }
  }
  return 0;
}

Assistant:

int
xmlShellDir(xmlShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        xmlDebugDumpDocumentHead(ctxt->output, (xmlDocPtr) node);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
        xmlDebugDumpAttr(ctxt->output, (xmlAttrPtr) node, 0);
    } else {
        xmlDebugDumpOneNode(ctxt->output, node, 0);
    }
    return (0);
}